

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_content_type.cpp
# Opt level: O2

void __thiscall cppcms::http::content_type::content_type(content_type *this,string *ct)

{
  char *begin;
  data *this_00;
  
  this_00 = (data *)operator_new(0x90);
  memset(this_00,0,0x90);
  data::data(this_00);
  std::__shared_ptr<cppcms::http::content_type::data,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppcms::http::content_type::data,void>
            ((__shared_ptr<cppcms::http::content_type::data,(__gnu_cxx::_Lock_policy)2> *)this,
             this_00);
  begin = (ct->_M_dataplus)._M_p;
  parse(this,begin,begin + ct->_M_string_length);
  return;
}

Assistant:

content_type::content_type(std::string const &ct) :
		d(new content_type::data())
	{
		char const *begin = ct.c_str();
		char const *end = begin + ct.size();
		parse(begin,end);
	}